

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  int *in_RDI;
  
  if (-1 < in_RDI[2]) {
    if ((in_RDI[2] < 0x7fffffff) && (-1 < *in_RDI)) {
      SetCursorPosYAndSetupForPrevLine(this._4_4_,this._0_4_);
    }
    in_RDI[2] = -1;
    in_RDI[3] = 3;
  }
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    if (ItemsCount < 0) // Already ended
        return;

    // In theory here we should assert that ImGui::GetCursorPosY() == StartPosY + DisplayEnd * ItemsHeight, but it feels saner to just seek at the end and not assert/crash the user.
    if (ItemsCount < INT_MAX && DisplayStart >= 0)
        SetCursorPosYAndSetupForPrevLine(StartPosY + (ItemsCount - ItemsFrozen) * ItemsHeight, ItemsHeight);
    ItemsCount = -1;
    StepNo = 3;
}